

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O0

QByteArray * __thiscall QMimeMagicRule::mask(QMimeMagicRule *this)

{
  long lVar1;
  long in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray *result;
  QStringBuilder<const_char_(&)[3],_QByteArray> *in_stack_ffffffffffffff58;
  QByteArray *in_stack_ffffffffffffff60;
  QByteArray *a;
  char in_stack_ffffffffffffffc7;
  QByteArray *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  a = in_RDI;
  QByteArray::QByteArray(in_stack_ffffffffffffff60,(QByteArray *)in_stack_ffffffffffffff58);
  if (*(int *)(in_RSI + 0x18) == 1) {
    QByteArray::toHex(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7);
    ::operator+((char (*) [3])a,in_stack_ffffffffffffff60);
    ::QStringBuilder::operator_cast_to_QByteArray(in_stack_ffffffffffffff58);
    QByteArray::operator=(in_stack_ffffffffffffff60,(QByteArray *)in_stack_ffffffffffffff58);
    QByteArray::~QByteArray((QByteArray *)0x8f4bb8);
    QStringBuilder<const_char_(&)[3],_QByteArray>::~QStringBuilder
              ((QStringBuilder<const_char_(&)[3],_QByteArray> *)0x8f4bc2);
    QByteArray::~QByteArray((QByteArray *)0x8f4bcc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QByteArray QMimeMagicRule::mask() const
{
    QByteArray result = m_mask;
    if (m_type == String) {
        // restore '0x'
        result = "0x" + result.toHex();
    }
    return result;
}